

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructSerializer.hpp
# Opt level: O0

void mserialize::
     StructSerializer<binlog::WriterProp,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::id>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::WriterProp::*,_&binlog::WriterProp::name>,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::batchSize>_>
     ::serialize<binlog::detail::VectorOutputStream>(WriterProp *t,VectorOutputStream *ostream)

{
  offset_in_WriterProp_to_unsigned_long in_stack_ffffffffffffffd8;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar2;
  
  uVar1 = 1;
  StructSerializer<binlog::WriterProp,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::id>,std::integral_constant<std::__cxx11::string_binlog::WriterProp::*,&binlog::WriterProp::name>,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::batchSize>>
  ::serialize_member<binlog::WriterProp,unsigned_long,binlog::detail::VectorOutputStream>
            ((WriterProp *)CONCAT44(in_stack_ffffffffffffffe4,1),in_stack_ffffffffffffffd8,
             (VectorOutputStream *)0x119a09);
  uVar2 = 0;
  StructSerializer<binlog::WriterProp,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::id>,std::integral_constant<std::__cxx11::string_binlog::WriterProp::*,&binlog::WriterProp::name>,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::batchSize>>
  ::serialize_member<binlog::WriterProp,std::__cxx11::string,binlog::detail::VectorOutputStream>
            ((WriterProp *)(ulong)uVar1,in_stack_ffffffffffffffd8,(VectorOutputStream *)0x119a25);
  StructSerializer<binlog::WriterProp,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::id>,std::integral_constant<std::__cxx11::string_binlog::WriterProp::*,&binlog::WriterProp::name>,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::batchSize>>
  ::serialize_member<binlog::WriterProp,unsigned_long,binlog::detail::VectorOutputStream>
            ((WriterProp *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffd8,
             (VectorOutputStream *)0x119a41);
  return;
}

Assistant:

static void serialize(const T& t, OutputStream& ostream)
  {
    using swallow = int[];
    (void)swallow{1, (serialize_member(t, Members::value, ostream), int{})...};
  }